

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexLookupVerifier.cpp
# Opt level: O0

bool tcu::isLookupResultValid
               (Texture1DView *texture,Sampler *sampler,LookupPrecision *prec,float coord,
               Vec2 *lodBounds,Vec4 *result)

{
  int *piVar1;
  LookupPrecision *pLVar2;
  LookupPrecision *sampler_00;
  bool bVar3;
  int iVar4;
  FilterMode FVar5;
  ConstPixelBufferAccess *pCVar6;
  ConstPixelBufferAccess *level1;
  float fVar7;
  int local_7c;
  int level_1;
  int maxLevel_1;
  int minLevel_1;
  float local_68;
  float local_64;
  float maxF;
  float minF;
  int level;
  int maxLevel;
  int minLevel;
  int maxTexLevel;
  int minTexLevel;
  bool isLinearMipmap;
  bool isNearestMipmap;
  bool canBeMinified;
  bool canBeMagnified;
  float maxLod;
  float minLod;
  Vec4 *result_local;
  Vec2 *lodBounds_local;
  LookupPrecision *pLStack_28;
  float coord_local;
  LookupPrecision *prec_local;
  Sampler *sampler_local;
  Texture1DView *texture_local;
  
  _maxLod = result;
  result_local = (Vec4 *)lodBounds;
  lodBounds_local._4_4_ = coord;
  pLStack_28 = prec;
  prec_local = (LookupPrecision *)sampler;
  sampler_local = (Sampler *)texture;
  _isLinearMipmap = Vector<float,_2>::x(lodBounds);
  minTexLevel = (int)Vector<float,_2>::y((Vector<float,_2> *)result_local);
  maxTexLevel._3_1_ = _isLinearMipmap <= (float)(prec_local->uvwBits).m_data[2];
  piVar1 = (prec_local->uvwBits).m_data + 2;
  maxTexLevel._2_1_ = (float)*piVar1 <= (float)minTexLevel && (float)minTexLevel != (float)*piVar1;
  if ((bool)maxTexLevel._3_1_) {
    pCVar6 = Texture1DView::getLevel((Texture1DView *)sampler_local,0);
    bVar3 = isLevelSampleResultValid
                      (pCVar6,(Sampler *)prec_local,(prec_local->uvwBits).m_data[1],pLStack_28,
                       lodBounds_local._4_4_,0,_maxLod);
    if (bVar3) {
      return true;
    }
  }
  if ((maxTexLevel._2_1_ & 1) != 0) {
    maxTexLevel._1_1_ = TexVerifierUtil::isNearestMipmapFilter((prec_local->uvwBits).m_data[0]);
    maxTexLevel._0_1_ = TexVerifierUtil::isLinearMipmapFilter((prec_local->uvwBits).m_data[0]);
    minLevel = 0;
    iVar4 = Texture1DView::getNumLevels((Texture1DView *)sampler_local);
    maxLevel = iVar4 + -1;
    if ((((byte)maxTexLevel & 1) == 0) || (maxLevel < 1)) {
      if ((maxTexLevel._1_1_ & 1) == 0) {
        pCVar6 = Texture1DView::getLevel((Texture1DView *)sampler_local,0);
        bVar3 = isLevelSampleResultValid
                          (pCVar6,(Sampler *)prec_local,(prec_local->uvwBits).m_data[0],pLStack_28,
                           lodBounds_local._4_4_,0,_maxLod);
        if (bVar3) {
          return true;
        }
      }
      else {
        fVar7 = ::deFloatCeil(_isLinearMipmap + 0.5);
        local_7c = de::clamp<int>((int)fVar7 + -1,0,maxLevel);
        fVar7 = ::deFloatFloor((float)minTexLevel + 0.5);
        iVar4 = de::clamp<int>((int)fVar7,0,maxLevel);
        for (; local_7c <= iVar4; local_7c = local_7c + 1) {
          pCVar6 = Texture1DView::getLevel((Texture1DView *)sampler_local,local_7c);
          pLVar2 = prec_local;
          FVar5 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
          bVar3 = isLevelSampleResultValid
                            (pCVar6,(Sampler *)pLVar2,FVar5,pLStack_28,lodBounds_local._4_4_,0,
                             _maxLod);
          if (bVar3) {
            return true;
          }
        }
      }
    }
    else {
      fVar7 = ::deFloatFloor(_isLinearMipmap);
      level = de::clamp<int>((int)fVar7,0,maxLevel + -1);
      fVar7 = ::deFloatFloor((float)minTexLevel);
      minF = (float)de::clamp<int>((int)fVar7,0,maxLevel + -1);
      for (maxF = (float)level; (int)maxF <= (int)minF; maxF = (float)((int)maxF + 1)) {
        local_64 = de::clamp<float>(_isLinearMipmap - (float)(int)maxF,0.0,1.0);
        local_68 = de::clamp<float>((float)minTexLevel - (float)(int)maxF,0.0,1.0);
        pCVar6 = Texture1DView::getLevel((Texture1DView *)sampler_local,(int)maxF);
        level1 = Texture1DView::getLevel((Texture1DView *)sampler_local,(int)maxF + 1);
        sampler_00 = prec_local;
        FVar5 = TexVerifierUtil::getLevelFilter((prec_local->uvwBits).m_data[0]);
        pLVar2 = pLStack_28;
        fVar7 = lodBounds_local._4_4_;
        Vector<float,_2>::Vector((Vector<float,_2> *)&maxLevel_1,local_64,local_68);
        bVar3 = isMipmapLinearSampleResultValid
                          (pCVar6,level1,(Sampler *)sampler_00,FVar5,pLVar2,fVar7,0,
                           (Vec2 *)&maxLevel_1,_maxLod);
        if (bVar3) {
          return true;
        }
      }
    }
  }
  return false;
}

Assistant:

bool isLookupResultValid (const Texture1DView& texture, const Sampler& sampler, const LookupPrecision& prec, const float coord, const Vec2& lodBounds, const Vec4& result)
{
	const float		minLod			= lodBounds.x();
	const float		maxLod			= lodBounds.y();
	const bool		canBeMagnified	= minLod <= sampler.lodThreshold;
	const bool		canBeMinified	= maxLod > sampler.lodThreshold;

	DE_ASSERT(isSamplerSupported(sampler));

	if (canBeMagnified)
	{
		if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.magFilter, prec, coord, 0, result))
			return true;
	}

	if (canBeMinified)
	{
		const bool	isNearestMipmap	= isNearestMipmapFilter(sampler.minFilter);
		const bool	isLinearMipmap	= isLinearMipmapFilter(sampler.minFilter);
		const int	minTexLevel		= 0;
		const int	maxTexLevel		= texture.getNumLevels()-1;

		DE_ASSERT(minTexLevel <= maxTexLevel);

		if (isLinearMipmap && minTexLevel < maxTexLevel)
		{
			const int		minLevel		= de::clamp((int)deFloatFloor(minLod), minTexLevel, maxTexLevel-1);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod), minTexLevel, maxTexLevel-1);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				const float		minF	= de::clamp(minLod - float(level), 0.0f, 1.0f);
				const float		maxF	= de::clamp(maxLod - float(level), 0.0f, 1.0f);

				if (isMipmapLinearSampleResultValid(texture.getLevel(level), texture.getLevel(level+1), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, Vec2(minF, maxF), result))
					return true;
			}
		}
		else if (isNearestMipmap)
		{
			// \note The accurate formula for nearest mipmapping is level = ceil(lod + 0.5) - 1 but Khronos has made
			//		 decision to allow floor(lod + 0.5) as well.
			const int		minLevel		= de::clamp((int)deFloatCeil(minLod + 0.5f) - 1,	minTexLevel, maxTexLevel);
			const int		maxLevel		= de::clamp((int)deFloatFloor(maxLod + 0.5f),		minTexLevel, maxTexLevel);

			DE_ASSERT(minLevel <= maxLevel);

			for (int level = minLevel; level <= maxLevel; level++)
			{
				if (isLevelSampleResultValid(texture.getLevel(level), sampler, getLevelFilter(sampler.minFilter), prec, coord, 0, result))
					return true;
			}
		}
		else
		{
			if (isLevelSampleResultValid(texture.getLevel(0), sampler, sampler.minFilter, prec, coord, 0, result))
				return true;
		}
	}

	return false;
}